

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

char * __thiscall CTcTokenizer::store_source_partial(CTcTokenizer *this,char *txt,size_t len)

{
  char *pcVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  char *p;
  
  pcVar1 = *(char **)(in_RDI + 0xcb8);
  memcpy(*(void **)(in_RDI + 0xcb8),in_RSI,in_RDX);
  *(size_t *)(in_RDI + 0xcb8) = in_RDX + *(long *)(in_RDI + 0xcb8);
  *(size_t *)(in_RDI + 0xcc0) = *(long *)(in_RDI + 0xcc0) - in_RDX;
  return pcVar1;
}

Assistant:

const char *CTcTokenizer::store_source_partial(const char *txt, size_t len)
{
    /* remember where the string starts */
    const char *p = src_ptr_;

    /* store the text */
    memcpy(src_ptr_, txt, len);

    /* advance the source block write position and length */
    src_ptr_ += len;
    src_rem_ -= len;

    /* return the storage pointer */
    return p;
}